

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

void scm::define(Environment *env,string *key,Object *value)

{
  Verbosity VVar1;
  mapped_type *ppOVar2;
  Object *obj;
  double __x;
  string local_48;
  
  VVar1 = loguru::current_verbosity_cutoff();
  if ((-1 < VVar1) && (LOG_ENVIRONMENT != '\0')) {
    toString_abi_cxx11_(&local_48,(scm *)value,obj);
    loguru::log(__x);
    std::__cxx11::string::~string((string *)&local_48);
  }
  ppOVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>_>_>
            ::operator[](&env->bindings,key);
  *ppOVar2 = value;
  return;
}

Assistant:

void define(Environment& env, std::string& key, Object* value)
{
  DLOG_IF_F(INFO, LOG_ENVIRONMENT, "define %s := %s", key.c_str(), toString(value).c_str());
  env.bindings[key] = value;
}